

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-pending-on-close.c
# Opt level: O0

int run_test_signal_close_loop_alive(void)

{
  int iVar1;
  undefined4 uVar2;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  
  iVar1 = uv_loop_init(&loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,99,"uv_loop_init(&loop)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_signal_init(&loop,&signal_hdl);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,100,"uv_signal_init(&loop, &signal_hdl)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_signal_start(&signal_hdl,stop_loop_cb,0xd);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x65,"uv_signal_start(&signal_hdl, stop_loop_cb, 13)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_unref(&signal_hdl);
  uVar2 = uv_os_getpid();
  iVar1 = uv_kill(uVar2,0xd);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x68,"uv_kill(uv_os_getpid(), 13)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_run(&loop,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x69,"uv_run(&loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_close(&signal_hdl,close_cb);
  iVar1 = uv_loop_alive(&loop);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x6b,"1","==","uv_loop_alive(&loop)",1,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_run(&loop,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x6d,"uv_run(&loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x6e,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  close_loop(&loop);
  iVar1 = uv_loop_close(&loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
            ,0x70,"0","==","uv_loop_close(&loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(signal_close_loop_alive) {
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_signal_init(&loop, &signal_hdl));
  ASSERT_OK(uv_signal_start(&signal_hdl, stop_loop_cb, SIGPIPE));
  uv_unref((uv_handle_t*) &signal_hdl);

  ASSERT_OK(uv_kill(uv_os_getpid(), SIGPIPE));
  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));
  uv_close((uv_handle_t*) &signal_hdl, close_cb);
  ASSERT_EQ(1, uv_loop_alive(&loop));

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}